

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_style_load_all_cursors(nk_context *ctx,nk_cursor *cursors)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  long lVar4;
  
  auVar1 = _DAT_0015f090;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x3a07,"void nk_style_load_all_cursors(struct nk_context *, struct nk_cursor *)")
    ;
  }
  lVar2 = 0;
  auVar3 = _DAT_0015f0b0;
  do {
    if (SUB164(auVar3 ^ auVar1,4) == -0x80000000 && SUB164(auVar3 ^ auVar1,0) < -0x7ffffff9) {
      (ctx->style).cursors[lVar2] = cursors;
      (ctx->style).cursors[lVar2 + 1] = cursors + 1;
    }
    lVar2 = lVar2 + 2;
    lVar4 = auVar3._8_8_;
    auVar3._0_8_ = auVar3._0_8_ + 2;
    auVar3._8_8_ = lVar4 + 2;
    cursors = cursors + 2;
  } while (lVar2 != 8);
  (ctx->style).cursor_visible = 1;
  return;
}

Assistant:

NK_API void
nk_style_load_all_cursors(struct nk_context *ctx, struct nk_cursor *cursors)
{
    int i = 0;
    struct nk_style *style;
    NK_ASSERT(ctx);
    if (!ctx) return;
    style = &ctx->style;
    for (i = 0; i < NK_CURSOR_COUNT; ++i)
        style->cursors[i] = &cursors[i];
    style->cursor_visible = nk_true;
}